

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::
ParserRefImpl<Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
          (ParserRefImpl<Catch::clara::detail::Opt> *this,anon_class_8_1_50637480_for_m_lambda *ref,
          string *hint)

{
  shared_ptr<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_foonathan[P]type_safe_build_O0_test_catch_hpp:9845:20)>_>
  local_30;
  string *local_20;
  string *hint_local;
  anon_class_8_1_50637480_for_m_lambda *ref_local;
  ParserRefImpl<Catch::clara::detail::Opt> *this_local;
  
  local_20 = hint;
  hint_local = (string *)ref;
  ref_local = (anon_class_8_1_50637480_for_m_lambda *)this;
  ComposableParserImpl<Catch::clara::detail::Opt>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::clara::detail::Opt>);
  (this->super_ComposableParserImpl<Catch::clara::detail::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_003802a8;
  this->m_optionality = Optional;
  ::std::
  make_shared<Catch::clara::detail::BoundLambda<Catch::makeCommandLineParser(Catch::ConfigData&)::__2>,Catch::makeCommandLineParser(Catch::ConfigData&)::__2_const&>
            ((anon_class_8_1_50637480_for_m_lambda *)&local_30);
  ::std::shared_ptr<Catch::clara::detail::BoundRef>::
  shared_ptr<Catch::clara::detail::BoundLambda<Catch::makeCommandLineParser(Catch::ConfigData&)::__2>,void>
            (&this->m_ref,&local_30);
  std::
  shared_ptr<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/build_O0/test/catch.hpp:9845:20)>_>
  ::~shared_ptr(&local_30);
  ::std::__cxx11::string::string((string *)&this->m_hint,(string *)local_20);
  ::std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

ParserRefImpl( LambdaT const &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundLambda<LambdaT>>( ref ) ),
            m_hint(hint)
        {}